

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IDisk.cpp
# Opt level: O3

int __thiscall IDisk::CompareToDisk(IDisk *this,IDisk *other_disk,bool exact)

{
  Side *pSVar1;
  uint uVar2;
  void *__s1;
  uint uVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  void *pvVar7;
  uint *puVar8;
  MFMTrack *track2;
  long lVar9;
  MFMTrack *pMVar10;
  ulong uVar11;
  ulong uVar12;
  Side *pSVar13;
  char str [1024];
  char local_438 [1032];
  
  uVar3 = (uint)other_disk->nb_sides_;
  if (other_disk->nb_sides_ < (byte)*(uint *)&this->nb_sides_) {
    uVar3 = *(uint *)&this->nb_sides_;
  }
  if ((char)uVar3 == '\0') {
    return 0;
  }
  uVar11 = 0;
  do {
    puVar8 = &other_disk->side_[uVar11].nb_tracks;
    uVar2 = this->side_[uVar11].nb_tracks;
    if (exact) {
      uVar6 = uVar2;
      if (uVar2 != *puVar8) {
        return -1;
      }
    }
    else {
      uVar6 = *puVar8;
    }
    if (uVar6 < uVar2) {
      uVar6 = uVar2;
    }
    if (uVar6 == 0) {
      iVar4 = 0;
    }
    else {
      pSVar1 = this->side_ + uVar11;
      pSVar13 = other_disk->side_ + uVar11;
      lVar9 = 0;
      uVar12 = 0;
      do {
        if (exact) {
          uVar2 = *(uint *)((long)&pSVar1->tracks->size + lVar9);
          pMVar10 = pSVar13->tracks;
          if (uVar2 != *(uint *)((long)&pMVar10->size + lVar9)) {
            return -1;
          }
          __s1 = *(void **)((long)&pSVar1->tracks->bitfield + lVar9);
          if (__s1 == (void *)0x0) {
            pvVar7 = *(void **)((long)&pMVar10->bitfield + lVar9);
LAB_00165fd0:
            return -(uint)(__s1 != pvVar7);
          }
          pvVar7 = *(void **)((long)&pMVar10->bitfield + lVar9);
          if (pvVar7 == (void *)0x0) {
            pvVar7 = (void *)0x0;
            goto LAB_00165fd0;
          }
          iVar4 = bcmp(__s1,pvVar7,(ulong)uVar2);
          iVar4 = -(uint)(iVar4 != 0);
        }
        else {
          if (uVar12 < pSVar1->nb_tracks) {
            pMVar10 = (MFMTrack *)((long)&pSVar1->tracks->revolution + lVar9);
          }
          else {
            pMVar10 = (MFMTrack *)0x0;
          }
          if (uVar12 < pSVar13->nb_tracks) {
            track2 = (MFMTrack *)((long)&pSVar13->tracks->revolution + lVar9);
          }
          else {
            track2 = (MFMTrack *)0x0;
          }
          iVar5 = CompareTracks(this,pMVar10,track2);
          iVar4 = 0;
          if (iVar5 != 0) {
            sprintf(local_438,"Erro track = %i",uVar12 & 0xffffffff);
            return iVar5;
          }
        }
        if (iVar4 != 0) break;
        uVar12 = uVar12 + 1;
        lVar9 = lVar9 + 0x20;
      } while (uVar12 < uVar6);
    }
    if (iVar4 != 0) {
      return iVar4;
    }
    uVar11 = uVar11 + 1;
    if ((uVar3 & 0xff) <= uVar11) {
      return 0;
    }
  } while( true );
}

Assistant:

int IDisk::CompareToDisk(IDisk* other_disk, bool exact)
{
   int idem = 0;

   int max_side = std::max(nb_sides_, other_disk->nb_sides_);

   for (int side = 0; side < max_side && idem == 0; side ++)
   {
      // For each side :
      if (exact && (side_[side].nb_tracks != other_disk->side_[side].nb_tracks))
      {
         return -1;
      }

      unsigned int maxTrack = std::max(side_[side].nb_tracks, other_disk->side_[side].nb_tracks);
      for (unsigned int track = 0; track < maxTrack && idem == 0; track++)
      {
         // For each track :
         // EXACT comparison ?
         if (exact)
         {
            if (side_[side].tracks[track].size != other_disk->side_[side].tracks[track].size)
            {
               return - 1;
            }
            if (side_[side].tracks[track].bitfield != nullptr && other_disk->side_[side].tracks[track].bitfield !=
               nullptr)
            {
               if (memcmp(side_[side].tracks[track].bitfield, other_disk->side_[side].tracks[track].bitfield,
                          side_[side].tracks[track].size) != 0)
               {
                  idem = -1;
               }
            }
            else
            {
               // ok if both are null
               return (side_[side].tracks[track].bitfield == other_disk->side_[side].tracks[track].bitfield) ? 0 : -1;
            }
         }
         else
         {
            // Otherwise...
            idem = CompareTracks((side_[side].nb_tracks > track) ? (&side_[side].tracks[track]) : nullptr,
                                 (other_disk->side_[side].nb_tracks > track)
                                    ? (&other_disk->side_[side].tracks[track])
                                    : nullptr);
            if (idem != 0)
            {
               char str[1024];
               sprintf(str, "Erro track = %i", track);
               //MessageBox(NULL, str, _T("Compare error"), MB_OK);
            }
         }
      }
   }

   return idem;
}